

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.h
# Opt level: O2

void __thiscall absl::lts_20240722::AlphaNum::AlphaNum(AlphaNum *this,long x)

{
  char *pcVar1;
  long lVar2;
  
  pcVar1 = this->digits_;
  lVar2 = absl::lts_20240722::numbers_internal::FastIntToBuffer(x,pcVar1);
  (this->piece_)._M_len = lVar2 - (long)pcVar1;
  (this->piece_)._M_str = pcVar1;
  return;
}

Assistant:

AlphaNum(long x)  // NOLINT(*)
      : piece_(digits_, static_cast<size_t>(
                            numbers_internal::FastIntToBuffer(x, digits_) -
                            &digits_[0])) {}